

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O1

void setsize_float(t_setsize *x,t_float f)

{
  t_gpointer *gp;
  char cVar1;
  t_symbol *ptVar2;
  _scalar *p_Var3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  t_symbol *s;
  t_symbol *ptVar8;
  t_template *ptVar9;
  t_gstub *ptVar10;
  void *pvVar11;
  _scalar *p_Var12;
  char *pcVar13;
  char *fmt;
  _glist *p_Var14;
  _inlet *x_00;
  int iVar15;
  t_gstub *ptVar16;
  t_gpointer *ptVar17;
  t_word *ptVar18;
  bool bVar19;
  int type;
  int onset;
  t_symbol *elemtemplatesym;
  int local_50;
  int local_4c;
  t_template *local_48;
  t_symbol *local_40;
  size_t local_38;
  
  ptVar8 = x->x_fieldsym;
  gp = &x->x_gp;
  ptVar16 = (x->x_gp).gp_stub;
  iVar5 = gpointer_check(gp,0);
  if (iVar5 == 0) {
    pd_error(x,"setsize: empty pointer");
    return;
  }
  ptVar2 = x->x_templatesym;
  cVar1 = *ptVar2->s_name;
  s = gpointer_gettemplatesym(gp);
  if ((cVar1 != '\0') && (bVar19 = ptVar2 != s, s = ptVar2, bVar19)) {
    pcVar13 = ptVar2->s_name;
    ptVar8 = gpointer_gettemplatesym(gp);
    pd_error(x,"setsize %s: got wrong template (%s)",pcVar13,ptVar8->s_name);
    return;
  }
  ptVar9 = template_findbyname(s);
  if (ptVar9 == (t_template *)0x0) {
    pd_error(x,"setsize: couldn\'t find template %s",s->s_name);
    return;
  }
  iVar5 = template_find_field(ptVar9,ptVar8,&local_4c,&local_50,&local_40);
  if (iVar5 == 0) {
    pcVar13 = ptVar8->s_name;
    fmt = "setsize: couldn\'t find array field %s";
LAB_00165855:
    pd_error(x,fmt,pcVar13);
    return;
  }
  if (local_50 != 3) {
    pcVar13 = ptVar8->s_name;
    fmt = "setsize: field %s not of type array";
    goto LAB_00165855;
  }
  iVar5 = ptVar16->gs_which;
  p_Var3 = (gp->gp_un).gp_scalar;
  ptVar9 = template_findbyname(local_40);
  if (ptVar9 == (t_template *)0x0) {
    pcVar13 = local_40->s_name;
    fmt = "setsize: couldn\'t find field template %s";
    goto LAB_00165855;
  }
  p_Var12 = (_scalar *)p_Var3->sc_vec;
  if (iVar5 == 2) {
    p_Var12 = p_Var3;
  }
  iVar5 = ptVar9->t_n * 8;
  piVar4 = *(int **)((long)p_Var12->sc_vec + (long)local_4c + -0x18);
  if (iVar5 != piVar4[1]) {
    bug("setsize_gpointer");
  }
  iVar15 = *piVar4;
  iVar6 = 1;
  if (1 < (int)f) {
    iVar6 = (int)f;
  }
  if (iVar6 == iVar15) {
    return;
  }
  ptVar10 = ptVar16;
  if (ptVar16->gs_which == 1) {
    iVar7 = glist_isvisible((ptVar16->gs_un).gs_glist);
    ptVar17 = gp;
    if (iVar7 == 0) goto LAB_0016589f;
  }
  else {
    do {
      p_Var14 = (ptVar10->gs_un).gs_glist;
      ptVar10 = (t_gstub *)p_Var14->gl_list;
    } while (ptVar10->gs_which == 2);
    iVar7 = glist_isvisible((ptVar10->gs_un).gs_glist);
    if (iVar7 == 0) goto LAB_0016589f;
    ptVar10 = (t_gstub *)p_Var14->gl_list;
    ptVar17 = (t_gpointer *)&(p_Var14->gl_obj).te_inlet;
  }
  gobj_vis(&((ptVar17->gp_un).gp_scalar)->sc_gobj,(ptVar10->gs_un).gs_glist,0);
LAB_0016589f:
  iVar7 = iVar6 - iVar15;
  local_48 = ptVar9;
  if ((iVar6 < iVar15) && (iVar7 != 0)) {
    ptVar18 = (t_word *)((long)(iVar5 * iVar6) + *(long *)(piVar4 + 2));
    do {
      word_free(ptVar18,local_48);
      ptVar18 = (t_word *)((long)ptVar18 + (long)iVar5);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0);
  }
  local_38 = (size_t)(iVar15 * iVar5);
  pvVar11 = resizebytes(*(void **)(piVar4 + 2),local_38,(long)(iVar5 * iVar6));
  ptVar9 = local_48;
  *(void **)(piVar4 + 2) = pvVar11;
  *piVar4 = iVar6;
  if ((iVar15 < iVar6) && (iVar6 != iVar15)) {
    ptVar18 = (t_word *)((long)pvVar11 + local_38);
    iVar15 = iVar15 - iVar6;
    do {
      word_init(ptVar18,ptVar9,gp);
      ptVar18 = (t_word *)((long)ptVar18 + (long)iVar5);
      iVar15 = iVar15 + 1;
    } while (iVar15 != 0);
  }
  piVar4[6] = piVar4[6] + 1;
  if (ptVar16->gs_which == 1) {
    iVar5 = glist_isvisible((ptVar16->gs_un).gs_glist);
    if (iVar5 == 0) {
      return;
    }
    x_00 = (_inlet *)(gp->gp_un).gp_scalar;
    p_Var14 = (ptVar16->gs_un).gs_glist;
  }
  else {
    do {
      p_Var14 = (ptVar16->gs_un).gs_glist;
      ptVar16 = (t_gstub *)p_Var14->gl_list;
    } while (ptVar16->gs_which == 2);
    iVar5 = glist_isvisible((ptVar16->gs_un).gs_glist);
    if (iVar5 == 0) {
      return;
    }
    x_00 = (p_Var14->gl_obj).te_inlet;
    p_Var14 = (_glist *)p_Var14->gl_list->g_pd;
  }
  gobj_vis((t_gobj *)x_00,p_Var14,1);
  return;
}

Assistant:

static void setsize_float(t_setsize *x, t_float f)
{
    int nitems, onset, type;
    t_symbol *templatesym, *fieldsym = x->x_fieldsym, *elemtemplatesym;
    t_template *template;
    t_template *elemtemplate;
    t_word *w;
    t_atom at;
    t_array *array;
    int elemsize;
    int newsize = f;
    t_gpointer *gp = &x->x_gp;
    t_gstub *gs = gp->gp_stub;
    if (!gpointer_check(&x->x_gp, 0))
    {
        pd_error(x, "setsize: empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) !=
            gpointer_gettemplatesym(gp))
        {
            pd_error(x, "setsize %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gp)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gp);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "setsize: couldn't find template %s", templatesym->s_name);
        return;
    }

    if (!template_find_field(template, fieldsym,
        &onset, &type, &elemtemplatesym))
    {
        pd_error(x,"setsize: couldn't find array field %s", fieldsym->s_name);
        return;
    }
    if (type != DT_ARRAY)
    {
        pd_error(x,"setsize: field %s not of type array", fieldsym->s_name);
        return;
    }
    if (gs->gs_which == GP_ARRAY) w = gp->gp_un.gp_w;
    else w = gp->gp_un.gp_scalar->sc_vec;

    if (!(elemtemplate = template_findbyname(elemtemplatesym)))
    {
        pd_error(x,"setsize: couldn't find field template %s",
            elemtemplatesym->s_name);
        return;
    }

    elemsize = elemtemplate->t_n * sizeof(t_word);

    array = *(t_array **)(((char *)w) + onset);

    if (elemsize != array->a_elemsize) bug("setsize_gpointer");

    nitems = array->a_n;
    if (newsize < 1) newsize = 1;
    if (newsize == nitems) return;

        /* erase the array before resizing it.  If we belong to a
        scalar it's easy, but if we belong to an element of another
        array we have to search back until we get to a scalar to erase.
        When graphics updates become queueable this may fall apart... */


    if (gs->gs_which == GP_GLIST)
    {
        if (glist_isvisible(gs->gs_un.gs_glist))
            gobj_vis((t_gobj *)(gp->gp_un.gp_scalar), gs->gs_un.gs_glist, 0);
    }
    else
    {
        t_array *owner_array = gs->gs_un.gs_array;
        while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
            owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
        if (glist_isvisible(owner_array->a_gp.gp_stub->gs_un.gs_glist))
            gobj_vis((t_gobj *)(owner_array->a_gp.gp_un.gp_scalar),
                owner_array->a_gp.gp_stub->gs_un.gs_glist, 0);
    }
        /* if shrinking, free the scalars that will disappear */
    if (newsize < nitems)
    {
        char *elem;
        int count;
        for (elem = ((char *)array->a_vec) + newsize * elemsize,
            count = nitems - newsize; count--; elem += elemsize)
                word_free((t_word *)elem, elemtemplate);
    }
        /* resize the array  */
    array->a_vec = (char *)resizebytes(array->a_vec,
        elemsize * nitems, elemsize * newsize);
    array->a_n = newsize;
        /* if growing, initialize new scalars */
    if (newsize > nitems)
    {
        char *elem;
        int count;
        for (elem = ((char *)array->a_vec) + nitems * elemsize,
            count = newsize - nitems; count--; elem += elemsize)
                word_init((t_word *)elem, elemtemplate, gp);
    }
        /* invalidate all gpointers into the array */
    array->a_valid++;

    /* redraw again. */
    if (gs->gs_which == GP_GLIST)
    {
        if (glist_isvisible(gs->gs_un.gs_glist))
            gobj_vis((t_gobj *)(gp->gp_un.gp_scalar), gs->gs_un.gs_glist, 1);
    }
    else
    {
        t_array *owner_array = gs->gs_un.gs_array;
        while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
            owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
        if (glist_isvisible(owner_array->a_gp.gp_stub->gs_un.gs_glist))
            gobj_vis((t_gobj *)(owner_array->a_gp.gp_un.gp_scalar),
                owner_array->a_gp.gp_stub->gs_un.gs_glist, 1);
    }
}